

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O2

void __thiscall PCA::pca_model::pca_model(pca_model *this,ggml_tensor *t_input)

{
  int64_t iVar1;
  void *pvVar2;
  ggml_backend_t pgVar3;
  ggml_context *pgVar4;
  ggml_tensor *pgVar5;
  ggml_backend_buffer_t pgVar6;
  undefined8 uVar7;
  size_type __n;
  ulong uVar8;
  size_t i;
  long lVar9;
  int iVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  result_type_conflict rVar11;
  vector<float,_std::allocator<float>_> random_vec;
  default_random_engine generator;
  undefined4 uVar12;
  undefined4 uVar13;
  float local_6c;
  _Vector_base<float,_std::allocator<float>_> local_68;
  long local_50;
  undefined8 uStack_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 local_38;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_30;
  
  this->backend = (ggml_backend_t)0x0;
  pgVar3 = (ggml_backend_t)ggml_backend_cpu_init();
  this->backend = pgVar3;
  local_50 = ggml_tensor_overhead();
  local_50 = local_50 << 2;
  uStack_48 = 0;
  local_40 = 1;
  uVar7 = CONCAT71(uStack_3f,1);
  uStack_48._0_4_ = 0;
  uVar12 = (undefined4)local_50;
  uVar13 = (undefined4)uStack_48;
  pgVar4 = (ggml_context *)ggml_init();
  this->ctx = pgVar4;
  iVar1 = t_input->ne[1];
  pgVar5 = (ggml_tensor *)
           ggml_new_tensor_2d(pgVar4,0,t_input->ne[0],iVar1,in_R8,in_R9,uVar12,uVar13,uVar7);
  this->dev_input = pgVar5;
  pgVar5 = (ggml_tensor *)ggml_new_tensor_2d(this->ctx,0,iVar1,iVar1);
  this->dev_square = pgVar5;
  pgVar5 = (ggml_tensor *)ggml_new_tensor_1d(this->ctx,0,iVar1);
  this->dev_eigenvector = pgVar5;
  ggml_set_name(this->dev_input,"dev_input");
  ggml_set_name(this->dev_square,"dev_square");
  ggml_set_name(this->dev_eigenvector,"dev_eigenvector");
  pgVar6 = (ggml_backend_buffer_t)ggml_backend_alloc_ctx_tensors(this->ctx,this->backend);
  this->buffer = pgVar6;
  pgVar5 = this->dev_input;
  pvVar2 = t_input->data;
  uVar7 = ggml_nbytes(t_input);
  ggml_backend_tensor_set(pgVar5,pvVar2,0,uVar7);
  __n = ggml_nelements(this->dev_eigenvector);
  local_30._M_x = (ulong)local_30._M_x._4_4_ << 0x20;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_68,__n,
             (value_type_conflict3 *)&local_30,(allocator_type *)&local_38);
  uVar8 = time((time_t *)0x0);
  iVar10 = (int)((uVar8 & 0xffffffff) % 0x7fffffff);
  local_30._M_x = (unsigned_long)(iVar10 + (uint)(iVar10 == 0));
  local_38 = 0x3f80000000000000;
  local_6c = 0.0;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_68._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar8 = uVar8 + 1) {
    rVar11 = std::uniform_real_distribution<float>::operator()
                       ((uniform_real_distribution<float> *)&local_38,&local_30);
    local_6c = local_6c + rVar11 * rVar11;
    local_68._M_impl.super__Vector_impl_data._M_start[uVar8] = rVar11;
  }
  if (local_6c < 0.0) {
    local_6c = sqrtf(local_6c);
  }
  else {
    local_6c = SQRT(local_6c);
  }
  for (lVar9 = 0;
      (long)local_68._M_impl.super__Vector_impl_data._M_finish -
      (long)local_68._M_impl.super__Vector_impl_data._M_start >> 2 != lVar9; lVar9 = lVar9 + 1) {
    local_68._M_impl.super__Vector_impl_data._M_start[lVar9] =
         local_68._M_impl.super__Vector_impl_data._M_start[lVar9] / local_6c;
  }
  pgVar5 = this->dev_eigenvector;
  uVar7 = ggml_nbytes(pgVar5);
  ggml_backend_tensor_set(pgVar5,local_68._M_impl.super__Vector_impl_data._M_start,0,uVar7);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

pca_model(struct ggml_tensor * t_input) {
#ifdef GGML_USE_CUDA
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        backend = ggml_backend_cuda_init(0); // init device 0
        if (!backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
#endif

// TODO: enable Metal support when support for GGML_OP_SQRT is added
// #ifdef GGML_USE_METAL
//         fprintf(stderr, "%s: using Metal backend\n", __func__);
//         backend = ggml_backend_metal_init();
//         if (!backend) {
//             fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
//         }
// #endif

        // if there aren't GPU Backends fallback to CPU backend
        if (!backend) {
            backend = ggml_backend_cpu_init();
        }

        const int num_tensors = 4;
        struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };
        ctx = ggml_init(params);

        auto n_samples = t_input->ne[0];
        auto n_embd    = t_input->ne[1];

        dev_input       = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_samples, n_embd);
        dev_square      = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd,    n_embd);
        dev_eigenvector = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        ggml_set_name(dev_input,       "dev_input");
        ggml_set_name(dev_square,      "dev_square");
        ggml_set_name(dev_eigenvector, "dev_eigenvector");
        buffer = ggml_backend_alloc_ctx_tensors(ctx, backend);
        ggml_backend_tensor_set(dev_input, t_input->data, 0, ggml_nbytes(t_input));

        // initialize eigenvector to random normalized vector
        {
            std::vector<float> random_vec(ggml_nelements(dev_eigenvector), 0.0);
            std::default_random_engine generator(static_cast<unsigned int>(std::time(0)));
            std::uniform_real_distribution<float> distribution(0.0, 1.0);
            float sum_sqr = 0.0; // for normalizing random_vec
            for (size_t i = 0; i < random_vec.size(); ++i) {
                float f = distribution(generator);
                sum_sqr += f * f;
                random_vec[i] = f;
            }
            // normalize it
            float random_vec_norm = std::sqrt(sum_sqr);
            for (size_t i = 0; i < random_vec.size(); ++i) {
                random_vec[i] /= random_vec_norm;
            }
            ggml_backend_tensor_set(dev_eigenvector, random_vec.data(), 0, ggml_nbytes(dev_eigenvector));
        }
    }